

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualLogicalCountExpr_Test::TestBody(ExprTest_EqualLogicalCountExpr_Test *this)

{
  NumericExpr lhs;
  NumericExpr lhs_00;
  NumericExpr lhs_01;
  NumericExpr lhs_02;
  Expr e2;
  Expr e2_00;
  bool bVar1;
  AssertionResult *this_00;
  char *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  CountExpr count;
  LogicalExpr args [1];
  NumericConstant n1;
  NumericConstant n0;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  AssertionResult *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar3;
  ExprBase in_stack_fffffffffffffe70;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int line;
  Type type;
  undefined4 uVar4;
  undefined4 uVar5;
  ExprBase in_stack_fffffffffffffe98;
  ExprBase e1;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  ExprTest *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> assertion_result;
  AssertHelper *in_stack_fffffffffffffee0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> this_02;
  AssertionResult local_d8;
  string local_c8 [64];
  AssertionResult *local_88;
  Impl *local_80;
  BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64> local_70;
  ExprBase local_60;
  Impl *local_58;
  BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64> local_48;
  AssertionResult local_38;
  BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> local_28;
  undefined8 local_20;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  ExprBase local_10;
  
  local_10.impl_ =
       (Impl *)ExprTest::MakeConst((ExprTest *)
                                   CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                                   6.37773532115798e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeConst((ExprTest *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
                           ,6.3778637782259e-318);
  local_20 = *(undefined8 *)(in_RDI + 0x48);
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeCount<1>
                 (in_stack_fffffffffffffea8,
                  (LogicalExpr (*) [1])CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
                 );
  type = (Type)((ulong)(in_RDI + 0x10) >> 0x20);
  local_58 = local_10.impl_;
  uVar5 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (NumericConstant)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_60.impl_ = (Impl *)local_28.super_ExprBase.impl_;
  uVar4 = 0x3c;
  lhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe7c;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe78;
  local_48.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalCount
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (Kind)((ulong)in_stack_fffffffffffffe60 >> 0x20),lhs,
                  (CountExpr)in_stack_fffffffffffffe70.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalCountExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (LogicalCountExpr)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_80 = local_10.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (NumericConstant)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_88 = (AssertionResult *)local_28.super_ExprBase.impl_;
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe7c;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe78;
  local_70.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalCount
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (Kind)((ulong)in_stack_fffffffffffffe60 >> 0x20),lhs_00,
                  (CountExpr)in_stack_fffffffffffffe70.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalCountExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (LogicalCountExpr)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  e2.super_ExprBase.impl_._4_4_ = uVar5;
  e2.super_ExprBase.impl_._0_4_ = uVar4;
  mp::Equal((Expr)in_stack_fffffffffffffe98.impl_,e2);
  e1.impl_ = (Impl *)&local_38;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)e1.impl_);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar5,uVar4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,uVar4),type,in_RDI,in_stack_fffffffffffffe7c,
               (char *)in_stack_fffffffffffffe70.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_c8);
    testing::Message::~Message((Message *)0x13b4cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b54a);
  this_00 = (AssertionResult *)(in_RDI + 0x10);
  uVar3 = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)(ulong)in_stack_fffffffffffffe68,
             (NumericConstant)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  uVar2 = 0x3c;
  lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe7c;
  lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe78;
  mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalCount
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uVar3,0x3c),
             (Kind)((ulong)this_00 >> 0x20),lhs_01,(CountExpr)in_stack_fffffffffffffe70.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalCountExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)CONCAT44(uVar3,uVar2),
             (LogicalCountExpr)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  this_02.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_18;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)CONCAT44(uVar3,uVar2),
             (NumericConstant)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe7c;
  lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe78;
  assertion_result.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_28;
  mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalCount
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uVar3,uVar2),
             (Kind)((ulong)this_00 >> 0x20),lhs_02,(CountExpr)in_stack_fffffffffffffe70.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalCountExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)CONCAT44(uVar3,uVar2),
             (LogicalCountExpr)in_stack_fffffffffffffe70.impl_,
             (type_conflict)((ulong)this_00 >> 0x20));
  e2_00.super_ExprBase.impl_._4_4_ = uVar5;
  e2_00.super_ExprBase.impl_._0_4_ = uVar4;
  mp::Equal((Expr)e1.impl_,e2_00);
  this_01 = &local_d8;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_fffffffffffffe5f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar5,uVar4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result.super_ExprBase.impl_,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,uVar4),type,in_RDI,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02.super_ExprBase.impl_,
               (Message *)assertion_result.super_ExprBase.impl_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    testing::Message::~Message((Message *)0x13b753);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b7c2);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalCountExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {l0};
  auto count = MakeCount(args);
  EXPECT_TRUE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                    factory_.MakeLogicalCount(expr::ATMOST, n0, count)));
  EXPECT_FALSE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                     factory_.MakeLogicalCount(expr::ATMOST, n1, count)));
}